

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radial_factory.hpp
# Opt level: O2

radial_grid_ptr IntegratorXX::RadialFactory::generate(RadialQuad rq,RadialTraits *traits)

{
  runtime_error *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  undefined4 in_register_0000003c;
  element_type *this_00;
  radial_grid_ptr rVar2;
  unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>_>_>
  uStack_18;
  
  this_00 = (element_type *)CONCAT44(in_register_0000003c,rq);
  switch((int)traits << 0x1c | (int)traits - 0x10U >> 4) {
  case 0:
    std::
    make_unique<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::BeckeRadialTraits>,IntegratorXX::RadialTraits_const&>
              ((RadialTraits *)&uStack_18);
    std::
    __shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::BeckeRadialTraits>,std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::BeckeRadialTraits>>,void>
              ((__shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
                *)this_00,&uStack_18);
    std::
    unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::BeckeRadialTraits>_>_>
    ::~unique_ptr(&uStack_18);
    _Var1._M_pi = extraout_RDX;
    break;
  case 1:
    std::
    make_unique<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>,IntegratorXX::RadialTraits_const&>
              ((RadialTraits *)&uStack_18);
    std::
    __shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>,std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MurrayHandyLamingRadialTraits<2ul>>>,void>
              ((__shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
                *)this_00,
               (unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>_>_>
                *)&uStack_18);
    std::
    unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>_>_>
    ::~unique_ptr((unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MurrayHandyLamingRadialTraits<2UL>_>_>_>
                   *)&uStack_18);
    _Var1._M_pi = extraout_RDX_02;
    break;
  case 2:
    std::
    make_unique<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,IntegratorXX::RadialTraits_const&>
              ((RadialTraits *)&uStack_18);
    std::
    __shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>,std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,double>,IntegratorXX::MuraKnowlesRadialTraits>>,void>
              ((__shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
                *)this_00,
               (unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>_>
                *)&uStack_18);
    std::
    unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>_>
    ::~unique_ptr((unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::UniformTrapezoid<double,_double>,_IntegratorXX::MuraKnowlesRadialTraits>_>_>
                   *)&uStack_18);
    _Var1._M_pi = extraout_RDX_00;
    break;
  case 3:
    std::
    make_unique<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>,IntegratorXX::RadialTraits_const&>
              ((RadialTraits *)&uStack_18);
    std::
    __shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
    ::
    __shared_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>,std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>,void>
              ((__shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>,(__gnu_cxx::_Lock_policy)2>
                *)this_00,
               (unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>_>_>
                *)&uStack_18);
    std::
    unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>_>_>
    ::~unique_ptr((unique_ptr<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>,_std::default_delete<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>_>_>
                   *)&uStack_18);
    _Var1._M_pi = extraout_RDX_01;
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Unsupported Radial Quadrature");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  rVar2.
  super___shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  rVar2.
  super___shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = this_00;
  return (radial_grid_ptr)
         rVar2.
         super___shared_ptr<IntegratorXX::QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

RadialFactory::radial_grid_ptr RadialFactory::generate(RadialQuad rq, const RadialTraits& traits) {

  switch(rq) {
    case RadialQuad::Becke:
      return std::make_unique<bk_type>(traits);
    case RadialQuad::MuraKnowles:
      return std::make_unique<mk_type>(traits);
    case RadialQuad::MurrayHandyLaming:
      return std::make_unique<mhl_type>(traits);
    case RadialQuad::TreutlerAhlrichs:
      return std::make_unique<ta_type>(traits);
    default:
      throw std::runtime_error("Unsupported Radial Quadrature");
      abort();
  } 
}